

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filekeyvaluestore.cpp
# Opt level: O1

void __thiscall
groundupdbext::FileKeyValueStore::loadKeysInto
          (FileKeyValueStore *this,
          function<void_(const_groundupdb::HashedValue_&,_groundupdb::EncodedValue)> *callback)

{
  size_type sVar1;
  ulong uVar2;
  char cVar3;
  int iVar4;
  path *ppVar5;
  long lVar6;
  void *pvVar7;
  undefined8 uVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  ulong uVar9;
  path *__p;
  undefined1 auVar10 [16];
  string hashWithExtension;
  string data;
  string type;
  string strhash;
  HashedKey key;
  string eol;
  size_t hash;
  path fp;
  ifstream t;
  stringstream sstream;
  directory_iterator local_558;
  directory_iterator local_548;
  long *local_538 [2];
  long local_528 [2];
  undefined1 *local_518;
  ulong local_510;
  undefined1 local_508;
  undefined7 uStack_507;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  undefined1 *local_4d8;
  undefined8 local_4d0;
  undefined1 local_4c8;
  undefined7 uStack_4c7;
  _Any_data *local_4b8;
  FileKeyValueStore *local_4b0;
  long *local_4a8 [2];
  long local_498 [2];
  HashedValue local_488;
  undefined1 *local_450;
  undefined8 local_448;
  undefined1 local_440;
  undefined7 uStack_43f;
  EncodedValue local_430;
  path local_3e8;
  path local_3c0 [13];
  path local_1b8 [3];
  ios_base local_138 [264];
  
  local_4d8 = &local_4c8;
  local_4d0 = 0;
  local_4c8 = 0;
  local_518 = &local_508;
  local_510 = 0;
  local_508 = 0;
  local_450 = &local_440;
  local_448 = 0;
  local_440 = 0;
  local_4b8 = (_Any_data *)callback;
  local_4b0 = this;
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_3e8,
             &((this->mImpl)._M_t.
               super___uniq_ptr_impl<groundupdbext::FileKeyValueStore::Impl,_std::default_delete<groundupdbext::FileKeyValueStore::Impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_groundupdbext::FileKeyValueStore::Impl_*,_std::default_delete<groundupdbext::FileKeyValueStore::Impl>_>
               .super__Head_base<0UL,_groundupdbext::FileKeyValueStore::Impl_*,_false>._M_head_impl)
              ->m_fullpath,auto_format);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            (&local_548,&local_3e8,none,(error_code *)0x0);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_548._M_dir._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_548._M_dir._M_refcount._M_pi + 8) =
           *(int *)(local_548._M_dir._M_refcount._M_pi + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_548._M_dir._M_refcount._M_pi + 8) =
           *(int *)(local_548._M_dir._M_refcount._M_pi + 8) + 1;
    }
  }
  local_558._M_dir._M_ptr = local_548._M_dir._M_ptr;
  local_558._M_dir._M_refcount._M_pi = local_548._M_dir._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_548._M_dir._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_548._M_dir._M_refcount._M_pi + 8) =
           *(int *)(local_548._M_dir._M_refcount._M_pi + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_548._M_dir._M_refcount._M_pi + 8) =
           *(int *)(local_548._M_dir._M_refcount._M_pi + 8) + 1;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_548._M_dir._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_548._M_dir._M_refcount._M_pi)
      ;
    }
  }
  do {
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558._M_dir._M_refcount._M_pi ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_548._M_dir._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_548._M_dir._M_refcount._M_pi);
      }
      Catch::clara::std::filesystem::__cxx11::path::~path((path *)&local_3e8);
      if (local_450 != &local_440) {
        operator_delete(local_450,CONCAT71(uStack_43f,local_440) + 1);
      }
      if (local_518 != &local_508) {
        operator_delete(local_518,CONCAT71(uStack_507,local_508) + 1);
      }
      if (local_4d8 != &local_4c8) {
        operator_delete(local_4d8,CONCAT71(uStack_4c7,local_4c8) + 1);
      }
      return;
    }
    ppVar5 = (path *)std::filesystem::__cxx11::directory_iterator::operator*(&local_558);
    cVar3 = *(char *)&ppVar5[1]._M_pathname._M_dataplus._M_p;
    if ((cVar3 == '\x03') || (cVar3 == '\0')) {
      cVar3 = std::filesystem::status(ppVar5);
    }
    if ((byte)(cVar3 - 1U) < 0xfe) {
      cVar3 = *(char *)&ppVar5[1]._M_pathname._M_dataplus._M_p;
      if ((cVar3 == '\x03') || (cVar3 == '\0')) {
        cVar3 = std::filesystem::status(ppVar5);
      }
      if (cVar3 == '\x01') {
        std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
                  (local_3c0,(char (*) [5])".key",auto_format);
        auVar10 = std::filesystem::__cxx11::path::_M_find_extension();
        if (auVar10._8_8_ == -1 || auVar10._0_8_ == 0) {
          std::filesystem::__cxx11::path::path((path *)local_1b8);
        }
        else {
          std::__cxx11::string::substr((ulong)&local_488,auVar10._0_8_);
          Catch::clara::std::filesystem::__cxx11::path::path
                    (local_1b8,(string_type *)&local_488,auto_format);
          if ((Bytes *)local_488._vptr_HashedValue != &local_488.m_data) {
            operator_delete(local_488._vptr_HashedValue,
                            (ulong)(local_488.m_data.
                                    super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                    _M_impl.super__Vector_impl_data._M_start + 1));
          }
        }
        iVar4 = std::filesystem::__cxx11::path::compare(local_3c0);
        Catch::clara::std::filesystem::__cxx11::path::~path(local_1b8);
        Catch::clara::std::filesystem::__cxx11::path::~path((path *)local_3c0);
        if (iVar4 == 0) {
          sVar1 = (ppVar5->_M_pathname)._M_string_length;
          if (sVar1 == 0) {
LAB_00195ed4:
            std::filesystem::__cxx11::path::path(local_3c0);
          }
          else {
            uVar2 = *(ulong *)&ppVar5->_M_cmpts;
            __p = ppVar5;
            if ((~(byte)uVar2 & 3) != 0) {
              if (((uVar2 & 3) == 0) && ((ppVar5->_M_pathname)._M_dataplus._M_p[sVar1 - 1] != '/'))
              {
                if ((uVar2 & 3) == 0) {
                  lVar6 = std::filesystem::__cxx11::path::_List::end();
                }
                else {
                  lVar6 = 0;
                }
                if (((byte)ppVar5->_M_cmpts & 3) == 0) {
                  __p = (path *)(lVar6 + -0x30);
                }
                if ((~*(uint *)&__p->_M_cmpts & 3) == 0) goto LAB_00195ec5;
              }
              goto LAB_00195ed4;
            }
LAB_00195ec5:
            Catch::clara::std::filesystem::__cxx11::path::path((path *)local_3c0,(path *)__p);
          }
          local_538[0] = local_528;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_538,local_3c0[0]._M_pathname._M_dataplus._M_p,
                     local_3c0[0]._M_pathname._M_dataplus._M_p +
                     local_3c0[0]._M_pathname._M_string_length);
          Catch::clara::std::filesystem::__cxx11::path::~path((path *)local_3c0);
          std::__cxx11::string::substr((ulong)local_4a8,(ulong)local_538);
          std::ifstream::ifstream((path *)local_3c0,(ppVar5->_M_pathname)._M_dataplus._M_p,_S_in);
          std::operator>>((istream *)local_3c0,(string *)&local_4d8);
          std::operator>>((istream *)local_3c0,(string *)&local_518);
          std::__cxx11::stringstream::stringstream
                    ((stringstream *)local_1b8,(string *)local_4a8,_S_out|_S_in);
          std::istream::_M_extract<unsigned_long>((ulong *)local_1b8);
          uVar2 = local_510;
          pvVar7 = operator_new__(local_510);
          if (uVar2 != 0) {
            uVar9 = 0;
            do {
              *(undefined1 *)((long)pvVar7 + uVar9) = local_518[uVar9];
              uVar9 = uVar9 + 1;
            } while (uVar2 != uVar9);
          }
          local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_4f8,pvVar7,(long)pvVar7 + uVar2);
          groundupdb::HashedValue::HashedValue<std::__cxx11::string>(&local_488,&local_4f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
            operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
          }
          iVar4 = std::__cxx11::string::compare((char *)&local_4d8);
          if (iVar4 != 0) {
            (*(local_4b0->super_KeyValueStore).super_Store._vptr_Store[3])
                      (&local_430,local_4b0,&local_488);
            if (*(long *)(local_4b8 + 1) == 0) {
              uVar8 = std::__throw_bad_function_call();
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558._M_dir._M_refcount._M_pi
                  != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_558._M_dir._M_refcount._M_pi);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_548._M_dir._M_refcount._M_pi
                  != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_548._M_dir._M_refcount._M_pi);
              }
              Catch::clara::std::filesystem::__cxx11::path::~path((path *)&local_3e8);
              if (local_450 != &local_440) {
                operator_delete(local_450,CONCAT71(uStack_43f,local_440) + 1);
              }
              if (local_518 != &local_508) {
                operator_delete(local_518,CONCAT71(uStack_507,local_508) + 1);
              }
              if (local_4d8 != &local_4c8) {
                operator_delete(local_4d8,CONCAT71(uStack_4c7,local_4c8) + 1);
              }
              _Unwind_Resume(uVar8);
            }
            (**(code **)((long)local_4b8 + 0x18))(local_4b8,&local_488,&local_430);
            local_430.m_value._vptr_HashedValue = (_func_int **)&PTR__HashedValue_001d4818;
            if (local_430.m_value.m_data.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_430.m_value.m_data.
                              super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_430.m_value.m_data.
                                    super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_430.m_value.m_data.
                                    super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
          }
          local_488._vptr_HashedValue = (_func_int **)&PTR__HashedValue_001d4818;
          if (local_488.m_data.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_488.m_data.
                            super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_488.m_data.
                                  super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_488.m_data.
                                  super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
          std::ios_base::~ios_base(local_138);
          std::ifstream::~ifstream(local_3c0);
          if (local_4a8[0] != local_498) {
            operator_delete(local_4a8[0],local_498[0] + 1);
          }
          if (local_538[0] != local_528) {
            operator_delete(local_538[0],local_528[0] + 1);
          }
        }
      }
    }
    std::filesystem::__cxx11::directory_iterator::operator++(&local_558);
  } while( true );
}

Assistant:

void
FileKeyValueStore::loadKeysInto(
    std::function<void(const HashedValue& key,EncodedValue value)> callback)
{
  std::string type;
  std::string data;
  std::string eol; // eol can be multiple characters
  std::size_t hash;
  // load any files with .kv in their name
  fs::path fp(mImpl->m_fullpath);
  for (auto& p : fs::directory_iterator(fp)) {
    if (p.exists() && p.is_regular_file()) {
      // check if extension is .kv
      if(".key" == p.path().extension()) {
        // If so, open file

        std::string hashWithExtension = p.path().filename().string();
        // ASSUMPTION always ends with .kv
        std::string strhash = hashWithExtension.substr(0,hashWithExtension.length() - 4); // BUG0000001
        // TODO check that file name is long enough
        // TODO check that file exists before opening

        std::ifstream t(p.path());
        t >> type;
        t >> data;
        // Construct hashed key
        std::stringstream sstream(strhash);
        sstream >> hash;
        char* cdata = new char[data.length()];
        const char* cstr = data.c_str();
        for (unsigned long i = 0;i < data.length();i++) {
          cdata[i] = cstr[i];
        }
        HashedKey key(std::string(cdata,data.length()));
        if ("set" == type) {
          // TODO support set as an encoded value
          //callback(key,getKeyValueSet(key));
        } else {
          callback(key,getKeyValue(key));
        }
      }
    }
  }
}